

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

size_t __thiscall
tsbp::TwoStepBranchingProcedure::InitializeSearchTree(TwoStepBranchingProcedure *this)

{
  pointer psVar1;
  unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> __p;
  size_t sVar2;
  int *piVar3;
  unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> layout2D;
  size_t rootNodeId;
  
  rootNodeId = boost::
               add_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::TwoStepBranchingProcedure::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                         (&(this->tree).super_type);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->activeNodes,&rootNodeId);
  sVar2 = rootNodeId;
  psVar1 = (this->tree).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1[rootNodeId].super_StoredVertex.m_property.super_BaseNode.ItemIdToPlace = -1;
  *(Status *)((long)&psVar1[rootNodeId].super_StoredVertex.m_property.super_BaseNode + 8) = Root;
  std::make_unique<tsbp::PackingRelaxed2D>();
  PackingRelaxed2D::Initialize
            ((PackingRelaxed2D *)
             layout2D._M_t.
             super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
             ._M_t.
             super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
             .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl,&this->items,
             &this->container);
  __p = layout2D;
  layout2D._M_t.
  super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>._M_t.
  super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>.
  super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl =
       (__uniq_ptr_data<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>,_true,_true>
        )(__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>)0x0;
  std::__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::reset
            ((__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
              *)&psVar1[sVar2].super_StoredVertex.m_property.Packing,
             (pointer)__p._M_t.
                      super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
                      .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl);
  if ((this->fixedItemAtOrigin).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged == true) {
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
              ((this->itemSpecificPlacementPointsX).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *piVar3);
    piVar3 = std::optional<int>::value(&this->fixedItemAtOrigin);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              ((this->itemSpecificPlacementPointsX).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *piVar3,0,true);
  }
  sVar2 = rootNodeId;
  std::unique_ptr<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::~unique_ptr
            (&layout2D);
  return sVar2;
}

Assistant:

size_t TwoStepBranchingProcedure::InitializeSearchTree()
{
    size_t rootNodeId = boost::add_vertex(this->tree);
    this->activeNodes.push_back(rootNodeId);

    Node& rootNode = this->tree[rootNodeId];
    rootNode.ItemIdToPlace = -1;
    rootNode.NodeStatus = BaseNode::Status::Root;

    std::unique_ptr<PackingRelaxed2D> layout2D = std::make_unique<PackingRelaxed2D>();
    layout2D->Initialize(items, container);

    rootNode.Packing = std::move(layout2D);

    if (this->fixedItemAtOrigin.has_value())
    {
        // Restrict placement of fixedItem
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].reset();
        this->itemSpecificPlacementPointsX[this->fixedItemAtOrigin.value()].set(0);

        ////this->tree.m_vertices.reserve(250000000);
    }

    return rootNodeId;
}